

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O1

void duckdb::Leaf::DeprecatedVacuum(ART *art,Node *node)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> this;
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var4;
  type paVar5;
  __node_base_ptr p_Var6;
  IndexPointer IVar7;
  long *plVar8;
  pointer this_00;
  data_ptr_t pdVar9;
  __hash_code __code;
  _Hash_node_base *p_Var10;
  ulong uVar11;
  long *plVar12;
  __node_base_ptr p_Var13;
  
  paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  IVar7.data = (node->super_IndexPointer).data;
  if (IVar7.data >> 0x38 != 0) {
    this._M_head_impl =
         paVar5->_M_elems[1].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    do {
      p_Var10 = (_Hash_node_base *)(IVar7.data & 0xffffffff);
      uVar1 = *(size_type *)((long)&(this._M_head_impl)->vacuum_buffers + 8);
      uVar11 = (ulong)p_Var10 % uVar1;
      p_Var2 = ((this._M_head_impl)->vacuum_buffers)._M_h._M_buckets[uVar11];
      p_Var6 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var6 = p_Var2, p_Var13 = p_Var2->_M_nxt, p_Var10 != p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var3 = p_Var13->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var6 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar11) ||
             (p_Var6 = p_Var13, p_Var13 = p_Var3, p_Var10 == p_Var3[1]._M_nxt)) goto LAB_01711754;
        }
        p_Var6 = (__node_base_ptr)0x0;
      }
LAB_01711754:
      if ((p_Var6 != (__node_base_ptr)0x0) && (p_Var6->_M_nxt != (_Hash_node_base *)0x0)) {
        IVar7 = FixedSizeAllocator::VacuumPointer(this._M_head_impl,IVar7);
        (node->super_IndexPointer).data = IVar7.data & 0xffffffffffffff | 0x200000000000000;
      }
      uVar1 = (node->super_IndexPointer).data;
      paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var4._M_head_impl =
           paVar5->_M_elems[1].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      uVar11 = uVar1 & 0xffffffff;
      plVar8 = *(long **)(*(long *)&((_Var4._M_head_impl)->buffers)._M_h +
                         (uVar11 % *(size_type *)((long)&(_Var4._M_head_impl)->buffers + 8)) * 8);
      for (plVar12 = (long *)*plVar8; uVar11 != plVar12[1]; plVar12 = (long *)*plVar12) {
        plVar8 = plVar12;
      }
      this_00 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                              *)(*plVar8 + 0x10));
      pdVar9 = FixedSizeBuffer::Get(this_00,true);
      node = (Node *)(pdVar9 + (_Var4._M_head_impl)->bitmask_offset +
                               (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) *
                               (_Var4._M_head_impl)->segment_size + 0x28);
      IVar7.data = (node->super_IndexPointer).data;
    } while (0xffffffffffffff < IVar7.data);
  }
  return;
}

Assistant:

void Leaf::DeprecatedVacuum(ART &art, Node &node) {
	D_ASSERT(node.HasMetadata());
	D_ASSERT(node.GetType() == LEAF);

	auto &allocator = Node::GetAllocator(art, LEAF);
	reference<Node> ref(node);
	while (ref.get().HasMetadata()) {
		if (allocator.NeedsVacuum(ref)) {
			ref.get() = allocator.VacuumPointer(ref);
			ref.get().SetMetadata(static_cast<uint8_t>(LEAF));
		}
		auto &leaf = Node::Ref<Leaf>(art, ref, LEAF);
		ref = leaf.ptr;
	}
}